

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_send_method(amqp_connection_state_t state,amqp_channel_t channel,amqp_method_number_t id,
                    void *decoded)

{
  int iVar1;
  amqp_time_t deadline;
  
  deadline = amqp_time_infinite();
  iVar1 = amqp_send_method_inner(state,channel,id,decoded,0,deadline);
  return iVar1;
}

Assistant:

int amqp_send_method(amqp_connection_state_t state, amqp_channel_t channel,
                     amqp_method_number_t id, void *decoded) {
  return amqp_send_method_inner(state, channel, id, decoded, AMQP_SF_NONE,
                                amqp_time_infinite());
}